

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall SocketInternals::Close(SocketInternals *this)

{
  int iVar1;
  ostream *this_00;
  int *piVar2;
  void *this_01;
  SocketInternals *this_local;
  
  if (this->SocketFD != -1) {
    iVar1 = close(this->SocketFD);
    if (iVar1 != 0) {
      this_00 = std::operator<<(this->outStr,"Close: failed to close socket, Error: ");
      piVar2 = __errno_location();
      this_01 = (void *)std::ostream::operator<<(this_00,*piVar2);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      return false;
    }
    this->SocketFD = -1;
  }
  return true;
}

Assistant:

bool SocketInternals::Close()
{
    if (SocketFD != INVALID_SOCKET) {
#ifdef _MSC_VER
        if (closesocket(SocketFD) != 0) {
            outStr << "Close: failed to close socket, Error: " << WSAGetLastError() <<std::endl;
            return false;
        }
        WSACleanup();
#else
        if (close(SocketFD) != 0) {
            outStr << "Close: failed to close socket, Error: " << errno << std::endl;
            return false;
        }
#endif
        SocketFD = INVALID_SOCKET;
    }
    return true;
}